

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-c.cpp
# Opt level: O2

duckdb_data_chunk duckdb_fetch_chunk(duckdb_result result)

{
  type pQVar1;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var2;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> local_10;
  
  if ((result.deprecated_rows_changed == 0) ||
     (*(char *)(result.deprecated_rows_changed + 8) == '\x03')) {
    _Var2._M_head_impl = (DataChunk *)0x0;
  }
  else {
    *(undefined1 *)(result.deprecated_rows_changed + 8) = 2;
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)result.deprecated_rows_changed);
    (*(pQVar1->super_BaseQueryResult)._vptr_BaseQueryResult[2])(&local_10,pQVar1);
    _Var2._M_head_impl =
         (DataChunk *)
         local_10._M_t.
         super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
         super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    local_10._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         (tuple<duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)
         (_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)0x0;
    std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_10);
  }
  return (duckdb_data_chunk)_Var2._M_head_impl;
}

Assistant:

duckdb_data_chunk duckdb_fetch_chunk(duckdb_result result) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *((duckdb::DuckDBResultData *)result.internal_data);
	if (result_data.result_set_type == duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_DEPRECATED) {
		return nullptr;
	}
	result_data.result_set_type = duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_STREAMING;
	auto &result_instance = (duckdb::QueryResult &)*result_data.result;
	// FetchRaw ? Do we care about flattening them?
	try {
		auto chunk = result_instance.Fetch();
		return reinterpret_cast<duckdb_data_chunk>(chunk.release());
	} catch (std::exception &e) {
		return nullptr;
	}
}